

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O3

int32 stat_retry(char *file,stat *statbuf)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 10;
  do {
    iVar1 = stat(file,(stat *)statbuf);
    if (iVar1 == 0) {
      return 0;
    }
    if (iVar2 == 10) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                     ,0x1fd,"Failed to stat file \'%s\'; retrying...",file);
    }
    sleep(1);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return -1;
}

Assistant:

int32
stat_retry(const char *file, struct stat * statbuf)
{
    int32 i;

    for (i = 0; i < STAT_RETRY_COUNT; i++) {
#ifndef HAVE_SYS_STAT_H
	FILE *fp;

	if ((fp = (FILE *)fopen(file, "r")) != 0) {
	    fseek(fp, 0, SEEK_END);
	    statbuf->st_size = ftell(fp);
	    fclose(fp);
	    return 0;
	}
#else /* HAVE_SYS_STAT_H */
        if (stat(file, statbuf) == 0)
            return 0;
#endif
        if (i == 0) {
            E_ERROR_SYSTEM("Failed to stat file '%s'; retrying...", file);
        }
#ifdef HAVE_UNISTD_H
        sleep(1);
#endif
    }

    return -1;
}